

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O0

void __thiscall OutputRedirect::flush(OutputRedirect *this)

{
  int iVar1;
  int *piVar2;
  char *s;
  undefined8 *in_RDI;
  int in_stack_0000001c;
  system_error *in_stack_00000020;
  string_view in_stack_00000028;
  int result;
  uint in_stack_ffffffffffffffc4;
  
  do {
    iVar1 = fflush((FILE *)*in_RDI);
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 & 0xffffff;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      in_stack_ffffffffffffffc4 = CONCAT13(*piVar2 == 4,(int3)in_stack_ffffffffffffffc4);
    }
  } while ((char)(in_stack_ffffffffffffffc4 >> 0x18) != '\0');
  if (iVar1 != 0) {
    s = (char *)__cxa_allocate_exception(0x18);
    piVar2 = __errno_location();
    fmt::v5::basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)CONCAT44(in_stack_ffffffffffffffc4,*piVar2),s);
    fmt::v5::system_error::system_error<>(in_stack_00000020,in_stack_0000001c,in_stack_00000028);
    __cxa_throw(s,&fmt::v5::system_error::typeinfo,fmt::v5::system_error::~system_error);
  }
  return;
}

Assistant:

void OutputRedirect::flush() {
#if EOF != -1
# error "FMT_RETRY assumes return value of -1 indicating failure"
#endif
  int result = 0;
  FMT_RETRY(result, fflush(file_));
  if (result != 0)
    throw fmt::system_error(errno, "cannot flush stream");
}